

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase480::run(TestCase480 *this)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char (*in_RDX) [4];
  char (*extraout_RDX) [4];
  char (*extraout_RDX_00) [4];
  char (*extraout_RDX_01) [4];
  char (*extraout_RDX_02) [4];
  char (*extraout_RDX_03) [4];
  char (*params) [4];
  DebugComparison<int,_int> _kjCondition;
  anon_class_8_1_c65f9af0 func;
  bool wasNull;
  DebugComparison<int,_int> local_f8;
  String local_d8;
  String local_b8;
  char local_a0;
  long local_98;
  undefined8 uStack_90;
  ArrayDisposer *local_88;
  StringPtr local_80;
  Maybe<kj::String> local_70;
  Maybe<kj::String> local_50;
  
  str<char_const(&)[4]>(&local_b8,(kj *)0x1e3499,in_RDX);
  local_d8.content.size_ = local_b8.content.size_;
  local_d8.content.ptr = local_b8.content.ptr;
  local_a0 = '\x01';
  local_88 = local_b8.content.disposer;
  local_b8.content.ptr = (char *)0x0;
  local_b8.content.size_ = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_80.content.ptr = "";
  if (local_d8.content.size_ != 0) {
    local_80.content.ptr = local_d8.content.ptr;
  }
  local_80.content.size_ = local_d8.content.size_ + (local_d8.content.size_ == 0);
  local_d8.content.disposer = local_b8.content.disposer;
  local_f8.left = StringPtr::parseAs<int>(&local_80);
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  params = extraout_RDX;
  if (local_d8.content.ptr != (char *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    params = extraout_RDX_00;
  }
  uVar4 = uStack_90;
  lVar3 = local_98;
  local_f8.result = local_f8.left == 0x7b;
  local_f8.right = 0x7b;
  local_f8.op.content.ptr = " == ";
  local_f8.op.content.size_ = 5;
  if ((local_a0 == '\x01') && (local_98 != 0)) {
    local_98 = 0;
    uStack_90 = 0;
    (**local_88->_vptr_ArrayDisposer)(local_88,lVar3,1,uVar4,uVar4,0);
    params = extraout_RDX_01;
  }
  sVar2 = local_b8.content.size_;
  pcVar1 = local_b8.content.ptr;
  if (local_b8.content.ptr != (char *)0x0) {
    local_b8.content.ptr = (char *)0x0;
    local_b8.content.size_ = 0;
    (**(local_b8.content.disposer)->_vptr_ArrayDisposer)
              (local_b8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    params = extraout_RDX_02;
  }
  if ((local_f8.result == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
               (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",&local_f8);
    params = extraout_RDX_03;
  }
  local_80.content.ptr = (char *)((ulong)local_80.content.ptr & 0xffffffffffffff00);
  local_b8.content.ptr = (char *)&local_80;
  str<char_const(&)[4]>(&local_d8,(kj *)0x1e3499,params);
  local_50.ptr.isSet = true;
  local_50.ptr.field_1.value.content.ptr = local_d8.content.ptr;
  local_50.ptr.field_1.value.content.size_ = local_d8.content.size_;
  local_50.ptr.field_1.value.content.disposer = local_d8.content.disposer;
  local_d8.content.ptr = (char *)0x0;
  local_d8.content.size_ = 0;
  local_f8.left =
       run::anon_class_8_1_c65f9af0::operator()((anon_class_8_1_c65f9af0 *)&local_b8,&local_50);
  uVar5 = local_50.ptr.field_1.value.content.size_;
  uVar4 = local_50.ptr.field_1.value.content.ptr;
  local_f8.result = local_f8.left == 0x7b;
  local_f8.right = 0x7b;
  local_f8.op.content.ptr = " == ";
  local_f8.op.content.size_ = 5;
  if ((local_50.ptr.isSet == true) && (local_50.ptr.field_1.value.content.ptr != (char *)0x0)) {
    local_50.ptr.field_1.value.content.ptr = (char *)0x0;
    local_50.ptr.field_1.value.content.size_ = 0;
    (**(local_50.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_50.ptr.field_1.value.content.disposer,uVar4,1,uVar5,uVar5,0);
  }
  sVar2 = local_d8.content.size_;
  pcVar1 = local_d8.content.ptr;
  if (local_d8.content.ptr != (char *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_f8.result == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x220,ERROR,
               "\"failed: expected \" \"func(kj::str(\\\"123\\\")) == 123\", _kjCondition",
               (char (*) [45])"failed: expected func(kj::str(\"123\")) == 123",&local_f8);
  }
  local_f8._0_8_ = CONCAT71(local_f8._1_7_,(char)local_80.content.ptr) ^ 1;
  if (((char)local_80.content.ptr != '\0') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x221,ERROR,"\"failed: expected \" \"!wasNull\", _kjCondition",
               (char (*) [26])"failed: expected !wasNull",(DebugExpression<bool> *)&local_f8);
  }
  local_70.ptr.isSet = false;
  local_f8.left =
       run::anon_class_8_1_c65f9af0::operator()((anon_class_8_1_c65f9af0 *)&local_b8,&local_70);
  uVar5 = local_70.ptr.field_1.value.content.size_;
  uVar4 = local_70.ptr.field_1.value.content.ptr;
  local_f8.result = local_f8.left == -1;
  local_f8.right = -1;
  local_f8.op.content.ptr = " == ";
  local_f8.op.content.size_ = 5;
  if ((local_70.ptr.isSet == true) && (local_70.ptr.field_1.value.content.ptr != (char *)0x0)) {
    local_70.ptr.field_1.value.content.ptr = (char *)0x0;
    local_70.ptr.field_1.value.content.size_ = 0;
    (**(local_70.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_70.ptr.field_1.value.content.disposer,uVar4,1,uVar5,uVar5,0);
  }
  if ((local_f8.result == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38],kj::_::DebugComparison<int,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x222,ERROR,"\"failed: expected \" \"func(kj::none) == -1\", _kjCondition",
               (char (*) [38])"failed: expected func(kj::none) == -1",&local_f8);
  }
  if (((char)local_80.content.ptr == '\0') && (_::Debug::minSeverity < 3)) {
    local_f8._0_8_ = &local_80;
    _::Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
               ,0x223,ERROR,"\"failed: expected \" \"wasNull\", _kjCondition",
               (char (*) [25])"failed: expected wasNull",(DebugExpression<bool_&> *)&local_f8);
  }
  return;
}

Assistant:

TEST(Common, MaybeUnwrapOrReturn) {
  {
    auto func = [](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR_RETURN(i, -1);
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(func(kj::none) == -1);
  }

  {
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR_RETURN(kj::mv(maybe), -1);
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(func(kj::none) == -1);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR_RETURN(i);
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

  // Test KJ_UNWRAP_OR
  {
    bool wasNull = false;
    auto func = [&](Maybe<int> i) -> int {
      int& j = KJ_UNWRAP_OR(i, {
        wasNull = true;
        return -1;
      });
      KJ_EXPECT(&j == &KJ_ASSERT_NONNULL(i));
      return j + 2;
    };

    KJ_EXPECT(func(123) == 125);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  {
    bool wasNull = false;
    auto func = [&](Maybe<String> maybe) -> int {
      String str = KJ_UNWRAP_OR(kj::mv(maybe), {
        wasNull = true;
        return -1;
      });
      return str.parseAs<int>();
    };

    KJ_EXPECT(func(kj::str("123")) == 123);
    KJ_EXPECT(!wasNull);
    KJ_EXPECT(func(kj::none) == -1);
    KJ_EXPECT(wasNull);
  }

  // Test void return.
  {
    int val = 0;
    auto func = [&](Maybe<int> i) {
      val = KJ_UNWRAP_OR(i, {
        return;
      });
    };

    func(123);
    KJ_EXPECT(val == 123);
    val = 321;
    func(kj::none);
    KJ_EXPECT(val == 321);
  }

}